

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void __thiscall Fossilize::StateRecorder::Impl::record_end(Impl *this)

{
  WorkItem local_38;
  
  std::mutex::lock(&this->record_lock);
  local_38.handle = 0;
  local_38.create_info = (void *)0x0;
  local_38.custom_hash = 0;
  local_38.type = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
  local_38._4_4_ = 0;
  push_work_locked(this,&local_38);
  pthread_mutex_unlock((pthread_mutex_t *)&this->record_lock);
  return;
}

Assistant:

void StateRecorder::Impl::record_end()
{
	// Signal end of recording with empty work item
	std::lock_guard<std::mutex> lock(record_lock);
	push_work_locked({ VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO /* dummy value */, 0, nullptr, 0 });
}